

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall QTeamCityLogger::~QTeamCityLogger(QTeamCityLogger *this)

{
  QTeamCityLogger *in_RDI;
  
  ~QTeamCityLogger(in_RDI);
  operator_delete(in_RDI,0x640);
  return;
}

Assistant:

void QTeamCityLogger::startLogging()
{
    QAbstractTestLogger::startLogging();

    tcEscapedString(&flowID, QTestResult::currentTestObjectName());

    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteStarted name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());
}